

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlerror.cpp
# Opt level: O1

QDebug operator<<(QDebug dbg,QSqlError *s)

{
  QSqlErrorPrivate *pQVar1;
  QArrayData *pQVar2;
  QArrayData *pQVar3;
  QArrayData *pQVar4;
  long *in_RDX;
  undefined8 *puVar5;
  long in_FS_OFFSET;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QDebugStateSaver saver;
  undefined8 local_58;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = 0xaaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_58,(QDebug *)s);
  pQVar1 = (s->d).d.ptr;
  *(undefined1 *)&(pQVar1->databaseError).d.size = 0;
  QVar6.m_data = (storage_type *)0xa;
  QVar6.m_size = (qsizetype)&local_50;
  QString::fromUtf8(QVar6);
  QTextStream::operator<<((QTextStream *)pQVar1,&local_50);
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar1 = (s->d).d.ptr;
  if ((char)(pQVar1->databaseError).d.size == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar1,' ');
  }
  pQVar2 = *(QArrayData **)(*in_RDX + 0x40);
  puVar5 = *(undefined8 **)(*in_RDX + 0x48);
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (puVar5 == (undefined8 *)0x0) {
    puVar5 = &QString::_empty;
  }
  QDebug::putString((QChar *)s,(ulong)puVar5);
  pQVar1 = (s->d).d.ptr;
  if ((char)(pQVar1->databaseError).d.size == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar1,' ');
  }
  pQVar1 = (s->d).d.ptr;
  QVar7.m_data = (storage_type *)0x2;
  QVar7.m_size = (qsizetype)&local_50;
  QString::fromUtf8(QVar7);
  QTextStream::operator<<((QTextStream *)pQVar1,&local_50);
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar1 = (s->d).d.ptr;
  if ((char)(pQVar1->databaseError).d.size == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar1,' ');
  }
  pQVar3 = *(QArrayData **)(*in_RDX + 8);
  puVar5 = *(undefined8 **)(*in_RDX + 0x10);
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (puVar5 == (undefined8 *)0x0) {
    puVar5 = &QString::_empty;
  }
  QDebug::putString((QChar *)s,(ulong)puVar5);
  pQVar1 = (s->d).d.ptr;
  if ((char)(pQVar1->databaseError).d.size == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar1,' ');
  }
  pQVar1 = (s->d).d.ptr;
  QVar8.m_data = (storage_type *)0x2;
  QVar8.m_size = (qsizetype)&local_50;
  QString::fromUtf8(QVar8);
  QTextStream::operator<<((QTextStream *)pQVar1,&local_50);
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar1 = (s->d).d.ptr;
  if ((char)(pQVar1->databaseError).d.size == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar1,' ');
  }
  pQVar4 = *(QArrayData **)(*in_RDX + 0x20);
  puVar5 = *(undefined8 **)(*in_RDX + 0x28);
  if (pQVar4 != (QArrayData *)0x0) {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (puVar5 == (undefined8 *)0x0) {
    puVar5 = &QString::_empty;
  }
  QDebug::putString((QChar *)s,(ulong)puVar5);
  pQVar1 = (s->d).d.ptr;
  if ((char)(pQVar1->databaseError).d.size == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar1,' ');
  }
  QTextStream::operator<<((QTextStream *)(s->d).d.ptr,')');
  pQVar1 = (s->d).d.ptr;
  if ((char)(pQVar1->databaseError).d.size == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar1,' ');
  }
  if (pQVar4 != (QArrayData *)0x0) {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar4,2,0x10);
    }
  }
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar3,2,0x10);
    }
  }
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar2,2,0x10);
    }
  }
  pQVar1 = (s->d).d.ptr;
  (s->d).d.ptr = (QSqlErrorPrivate *)0x0;
  *(QSqlErrorPrivate **)dbg.stream = pQVar1;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QSqlError &s)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace();
    dbg << "QSqlError(" << s.nativeErrorCode() << ", " << s.driverText()
        << ", " << s.databaseText() << ')';
    return dbg;
}